

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O0

void __thiscall
BoundaryElement::particle_particle_interact
          (BoundaryElement *this,double *potential,double *potential_old,
          array<unsigned_long,_2UL> target_node_element_idxs,
          array<unsigned_long,_2UL> source_node_element_idxs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  ulong uVar15;
  value_type_conflict2 vVar16;
  ulong uVar17;
  reference pvVar18;
  double *pdVar19;
  double *pdVar20;
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  double *pdVar24;
  double *pdVar25;
  size_t sVar26;
  long in_RDX;
  long in_RSI;
  Timer *in_RDI;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double L4;
  double L3;
  double L2;
  double L1;
  double G4;
  double G3;
  double dot_tqsq;
  double tp2;
  double tp1;
  double target_cos;
  double source_cos;
  double Gk;
  double exp_kappa_r;
  double kappa_r;
  double G0;
  double one_over_r;
  double r;
  double dist_z;
  double dist_y;
  double dist_x;
  double potential_old_1;
  double potential_old_0;
  double source_area;
  double source_nz;
  double source_ny;
  double source_nx;
  double source_z;
  double source_y;
  double source_x;
  size_t k;
  double pot_temp_2;
  double pot_temp_1;
  double target_nz;
  double target_ny;
  double target_nx;
  double target_z;
  double target_y;
  double target_x;
  size_t j;
  size_t num_elements;
  double *elements_area_ptr;
  double *elements_nz_ptr;
  double *elements_ny_ptr;
  double *elements_nx_ptr;
  double *elements_z_ptr;
  double *elements_y_ptr;
  double *elements_x_ptr;
  double kappa2;
  double kappa;
  double eps;
  size_t source_node_element_end;
  size_t source_node_element_begin;
  size_t target_node_element_end;
  size_t target_node_element_begin;
  undefined1 *__n;
  Timer *in_stack_fffffffffffffe30;
  ulong local_f0;
  double local_e8;
  double local_e0;
  ulong local_a8;
  
  __n = &stack0x00000008;
  Timer::start(in_RDI);
  pvVar18 = std::array<unsigned_long,_2UL>::operator[]
                      ((array<unsigned_long,_2UL> *)in_RDI,(size_type)__n);
  local_a8 = *pvVar18;
  pvVar18 = std::array<unsigned_long,_2UL>::operator[]
                      ((array<unsigned_long,_2UL> *)in_RDI,(size_type)__n);
  uVar15 = *pvVar18;
  pvVar18 = std::array<unsigned_long,_2UL>::operator[]
                      ((array<unsigned_long,_2UL> *)in_RDI,(size_type)__n);
  vVar16 = *pvVar18;
  pvVar18 = std::array<unsigned_long,_2UL>::operator[]
                      ((array<unsigned_long,_2UL> *)in_RDI,(size_type)__n);
  uVar17 = *pvVar18;
  dVar1 = *(double *)((long)in_RDI[1].elapsed_time_.__r + 0x278);
  dVar2 = *(double *)((long)in_RDI[1].elapsed_time_.__r + 0x280);
  dVar3 = *(double *)((long)in_RDI[1].elapsed_time_.__r + 0x288);
  pdVar19 = Particles::x_ptr((Particles *)0x126dc1);
  pdVar20 = Particles::y_ptr((Particles *)0x126dd9);
  pdVar21 = Particles::z_ptr((Particles *)0x126df1);
  pdVar22 = Elements::nx_ptr((Elements *)0x126e09);
  pdVar23 = Elements::ny_ptr((Elements *)0x126e21);
  pdVar24 = Elements::nz_ptr((Elements *)0x126e39);
  pdVar25 = Elements::area_ptr((Elements *)0x126e51);
  sVar26 = Particles::num((Particles *)(in_RDI->start_time_).__d.__r);
  for (; local_a8 < uVar15; local_a8 = local_a8 + 1) {
    dVar4 = pdVar19[local_a8];
    dVar5 = pdVar20[local_a8];
    dVar6 = pdVar21[local_a8];
    dVar7 = pdVar22[local_a8];
    dVar8 = pdVar23[local_a8];
    dVar9 = pdVar24[local_a8];
    local_e0 = 0.0;
    local_e8 = 0.0;
    for (local_f0 = vVar16; local_f0 < uVar17; local_f0 = local_f0 + 1) {
      dVar35 = pdVar22[local_f0];
      dVar10 = pdVar23[local_f0];
      dVar11 = pdVar24[local_f0];
      dVar12 = pdVar25[local_f0];
      dVar13 = *(double *)(in_RDX + local_f0 * 8);
      dVar14 = *(double *)(in_RDX + (local_f0 + sVar26) * 8);
      dVar27 = pdVar19[local_f0] - dVar4;
      dVar28 = pdVar20[local_f0] - dVar5;
      dVar29 = pdVar21[local_f0] - dVar6;
      dVar30 = sqrt(dVar29 * dVar29 + dVar27 * dVar27 + dVar28 * dVar28);
      if (0.0 < dVar30) {
        dVar31 = 1.0 / dVar30;
        dVar32 = dVar31 * 0.079577471545948;
        dVar30 = dVar2 * dVar30;
        dVar33 = exp(-dVar30);
        dVar34 = (dVar11 * dVar29 + dVar35 * dVar27 + dVar10 * dVar28) * dVar31;
        dVar27 = (dVar9 * dVar29 + dVar7 * dVar27 + dVar8 * dVar28) * dVar31;
        dVar28 = dVar32 * dVar31;
        dVar29 = (dVar30 + 1.0) * dVar33;
        dVar35 = (-(dVar27 * 3.0) * dVar34 + dVar11 * dVar9 + dVar35 * dVar7 + dVar10 * dVar8) *
                 dVar31 * dVar28;
        in_stack_fffffffffffffe30 =
             (Timer *)((dVar29 * dVar35 + -(dVar3 * dVar27 * dVar34 * dVar33 * dVar32)) - dVar35);
        local_e0 = (dVar34 * dVar28 * (-dVar29 * dVar1 + 1.0) * dVar13 +
                   (dVar32 - dVar33 * dVar32) * dVar14) * dVar12 + local_e0;
        local_e8 = ((double)in_stack_fffffffffffffe30 * dVar13 +
                   dVar27 * dVar28 * (1.0 - dVar29 / dVar1) * dVar14) * dVar12 + local_e8;
      }
    }
    *(double *)(in_RSI + local_a8 * 8) = local_e0 + *(double *)(in_RSI + local_a8 * 8);
    *(double *)(in_RSI + (local_a8 + sVar26) * 8) =
         local_e8 + *(double *)(in_RSI + (local_a8 + sVar26) * 8);
  }
  Timer::stop(in_stack_fffffffffffffe30);
  return;
}

Assistant:

void BoundaryElement::particle_particle_interact(double* __restrict potential,
                                          const double* __restrict potential_old,
                                          std::array<std::size_t, 2> target_node_element_idxs,
                                          std::array<std::size_t, 2> source_node_element_idxs)
{
    timers_.particle_particle_interact.start();

    std::size_t target_node_element_begin = target_node_element_idxs[0];
    std::size_t target_node_element_end   = target_node_element_idxs[1];

    std::size_t source_node_element_begin = source_node_element_idxs[0];
    std::size_t source_node_element_end   = source_node_element_idxs[1];
    
    double eps    = params_.phys_eps_;
    double kappa  = params_.phys_kappa_;
    double kappa2 = params_.phys_kappa2_;
    
    const double* __restrict elements_x_ptr    = elements_.x_ptr();
    const double* __restrict elements_y_ptr    = elements_.y_ptr();
    const double* __restrict elements_z_ptr    = elements_.z_ptr();
    
    const double* __restrict elements_nx_ptr   = elements_.nx_ptr();
    const double* __restrict elements_ny_ptr   = elements_.ny_ptr();
    const double* __restrict elements_nz_ptr   = elements_.nz_ptr();

    const double* __restrict elements_area_ptr = elements_.area_ptr();
    
    std::size_t num_elements = elements_.num();

#ifdef OPENACC_ENABLED
    int stream_id = std::rand() % 3;
    #pragma acc parallel loop async(stream_id) present(elements_x_ptr,  elements_y_ptr,  elements_z_ptr, \
                                      elements_nx_ptr, elements_ny_ptr, elements_nz_ptr, \
                                      elements_area_ptr, potential, potential_old)
#endif
    for (std::size_t j = target_node_element_begin; j < target_node_element_end; ++j) {
        
        double target_x = elements_x_ptr[j];
        double target_y = elements_y_ptr[j];
        double target_z = elements_z_ptr[j];
        
        double target_nx = elements_nx_ptr[j];
        double target_ny = elements_ny_ptr[j];
        double target_nz = elements_nz_ptr[j];
        
        double pot_temp_1 = 0.;
        double pot_temp_2 = 0.;

#ifdef OPENACC_ENABLED
        #pragma acc loop reduction(+:pot_temp_1,pot_temp_2)
#endif
        for (std::size_t k = source_node_element_begin; k < source_node_element_end; ++k) {
        
            double source_x = elements_x_ptr[k];
            double source_y = elements_y_ptr[k];
            double source_z = elements_z_ptr[k];
            
            double source_nx = elements_nx_ptr[k];
            double source_ny = elements_ny_ptr[k];
            double source_nz = elements_nz_ptr[k];
            double source_area = elements_area_ptr[k];
            
            double potential_old_0 = potential_old[k];
            double potential_old_1 = potential_old[k + num_elements];
            
            double dist_x = source_x - target_x;
            double dist_y = source_y - target_y;
            double dist_z = source_z - target_z;
            double r = std::sqrt(dist_x * dist_x + dist_y * dist_y + dist_z * dist_z);
            
            if (r > 0) {
                double one_over_r = 1. / r;
                double G0 = constants::ONE_OVER_4PI * one_over_r;
                double kappa_r = kappa * r;
                double exp_kappa_r = std::exp(-kappa_r);
                double Gk = exp_kappa_r * G0;
                
                double source_cos  = (source_nx * dist_x + source_ny * dist_y + source_nz * dist_z) * one_over_r;
                double target_cos = (target_nx * dist_x + target_ny * dist_y + target_nz * dist_z) * one_over_r;
                
                double tp1 = G0 * one_over_r;
                double tp2 = (1. + kappa_r) * exp_kappa_r;

                double dot_tqsq = source_nx * target_nx + source_ny * target_ny + source_nz * target_nz;
                double G3 = (dot_tqsq - 3. * target_cos * source_cos) * one_over_r * tp1;
                double G4 = tp2 * G3 - kappa2 * target_cos * source_cos * Gk;

                double L1 = source_cos  * tp1 * (1. - tp2 * eps);
                double L2 = G0 - Gk;
                double L3 = G4 - G3;
                double L4 = target_cos * tp1 * (1. - tp2 / eps);
                
                pot_temp_1 += (L1 * potential_old_0 + L2 * potential_old_1) * source_area;
                pot_temp_2 += (L3 * potential_old_0 + L4 * potential_old_1) * source_area;
            }
        }
        
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        potential[j]                += pot_temp_1;
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        potential[j + num_elements] += pot_temp_2;
    }

    timers_.particle_particle_interact.stop();
}